

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wrinkles.cpp
# Opt level: O0

void __thiscall Wrinkles::apply(Wrinkles *this,Vector *p,SurfaceData *t)

{
  Vector local_d8;
  Vector local_c0;
  Vector local_a8;
  Vector local_90;
  Vector local_78;
  int local_5c;
  double dStack_58;
  int i;
  double scale;
  Vector value;
  Vector result;
  SurfaceData *t_local;
  Vector *p_local;
  Wrinkles *this_local;
  
  Vector::Vector((Vector *)&value.z,0.0);
  Vector::Vector((Vector *)&scale);
  dStack_58 = 1.0;
  if ((this->amount != 0.0) || (NAN(this->amount))) {
    for (local_5c = 0; local_5c < 10; local_5c = local_5c + 1) {
      operator*(&local_90,p,dStack_58);
      noise_3d(&local_78,&local_90);
      Vector::operator=((Vector *)&scale,&local_78);
      value.z = ABS(scale / dStack_58) + value.z;
      dStack_58 = dStack_58 * 2.0;
    }
    operator*(&local_a8,(Vector *)&value.z,this->amount);
    Vector::operator+=(&t->n,&local_a8);
    Vector::Vector(&local_d8,&t->n);
    normalize(&local_c0,&local_d8);
    Vector::operator=(&t->n,&local_c0);
  }
  return;
}

Assistant:

void Wrinkles::apply( Vector& p, Grayzer::SurfaceData& t )
{
   Vector result (0.0);
   Vector value;
   double scale = 1.0;
   int   i;

   if(   amount == 0.0 )   return;

   for( i = 0; i <   10;   scale *= 2.0, i++ )
   {
      value =  noise_3d( p * scale  );
      result.x += fabs(value.x / scale);
      result.y += fabs(value.y / scale);
      result.z += fabs(value.z / scale);
   }
   t.n   += result * amount;
   t.n   = normalize( t.n );
}